

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

BaseNode * __thiscall
asmjit::v1_14::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  long lVar1;
  BaseNode *pBVar2;
  long *plVar3;
  NodeList *pNVar4;
  long *plVar5;
  BaseNode *pBVar6;
  
  if (*(long *)node == 0) {
    if (*(long *)(node + 8) != 0) goto LAB_00116e46;
    if (-1 < (char)node[0x11]) {
      if ((char)ref[0x11] < '\0') {
        lVar1 = *(long *)ref;
        *(long *)node = lVar1;
        *(BaseNode **)(node + 8) = ref;
        node[0x11] = (BaseNode)((byte)node[0x11] | 0x80);
        if (node[0x10] == (BaseNode)0x2) {
          this->_dirtySectionLinks = true;
        }
        *(BaseNode **)ref = node;
        pNVar4 = (NodeList *)(lVar1 + 8);
        if (lVar1 == 0) {
          pNVar4 = &this->_nodeList;
        }
        *(BaseNode **)pNVar4 = node;
        return node;
      }
      goto LAB_00116e50;
    }
  }
  else {
    addBefore();
LAB_00116e46:
    addBefore();
  }
  addBefore();
LAB_00116e50:
  addBefore();
  if ((char)node[0x11] < '\0') {
    pBVar2 = *(BaseNode **)node;
    plVar3 = *(long **)(node + 8);
    pBVar6 = pBVar2 + 8;
    if (*(BaseNode **)&this->_nodeList == node) {
      pBVar6 = (BaseNode *)&this->_nodeList;
    }
    *(long **)pBVar6 = plVar3;
    plVar5 = (long *)&this->field_0x1a8;
    if (*(BaseNode **)&this->field_0x1a8 != node) {
      plVar5 = plVar3;
    }
    *plVar5 = (long)pBVar2;
    *(long *)node = 0;
    *(long *)(node + 8) = 0;
    node[0x11] = (BaseNode)((byte)node[0x11] & 0x7f);
    if (node[0x10] == (BaseNode)0x2) {
      this->_dirtySectionLinks = true;
    }
    if (this->_cursor == node) {
      this->_cursor = pBVar2;
      return node;
    }
  }
  return node;
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _nodeList._first = node;

  return node;
}